

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# walker-inl.h
# Opt level: O3

Frag __thiscall
re2::Regexp::Walker<re2::Frag>::WalkInternal
          (Walker<re2::Frag> *this,Regexp *re,Frag top_arg,bool use_copy)

{
  ushort uVar1;
  int iVar2;
  deque<re2::WalkState<re2::Frag>,std::allocator<re2::WalkState<re2::Frag>>> *pdVar3;
  undefined8 *puVar4;
  stack<re2::WalkState<re2::Frag>,_std::deque<re2::WalkState<re2::Frag>,_std::allocator<re2::WalkState<re2::Frag>_>_>_>
  *psVar5;
  _Map_pointer ppWVar6;
  WalkState<re2::Frag> *pWVar7;
  long *plVar8;
  PatchList extraout_var;
  anon_union_8_2_3df47e5c_for_Regexp_7 *paVar9;
  Frag FVar10;
  PatchList extraout_var_01;
  PatchList extraout_var_02;
  WalkState<re2::Frag> *pWVar11;
  Frag *pFVar12;
  Regexp *pRVar13;
  _Elt_pointer pWVar14;
  uint uVar15;
  bool stop;
  undefined1 local_1b0 [20];
  uint32 uStack_19c;
  PatchList PStack_198;
  uint32 uStack_194;
  PatchList PStack_190;
  uint uStack_18c;
  Frag *local_188;
  PatchList extraout_var_00;
  
  Reset(this);
  if (re == (Regexp *)0x0) {
    LogMessage::LogMessage
              ((LogMessage *)local_1b0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/walker-inl.h",
               0xa0,3);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_1b0 + 8),"Walk NULL",9);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_1b0);
  }
  else {
    pdVar3 = (deque<re2::WalkState<re2::Frag>,std::allocator<re2::WalkState<re2::Frag>>> *)
             this->stack_;
    local_1b0._8_4_ = -1;
    local_1b0._12_4_ = top_arg.begin;
    local_1b0._16_4_ = top_arg.end.p;
    local_188 = (Frag *)0x0;
    uStack_19c = 0;
    PStack_198.p = 0;
    uStack_194 = 0;
    PStack_190.p = 0;
    puVar4 = *(undefined8 **)(pdVar3 + 0x30);
    local_1b0._0_8_ = re;
    if (puVar4 == (undefined8 *)(*(long *)(pdVar3 + 0x40) + -0x30)) {
      std::deque<re2::WalkState<re2::Frag>,std::allocator<re2::WalkState<re2::Frag>>>::
      _M_push_back_aux<re2::WalkState<re2::Frag>>(pdVar3,(WalkState<re2::Frag> *)local_1b0);
    }
    else {
      puVar4[4] = (ulong)uStack_18c << 0x20;
      puVar4[5] = 0;
      puVar4[2] = (ulong)(uint)local_1b0._16_4_;
      puVar4[3] = 0;
      *puVar4 = re;
      puVar4[1] = CONCAT44(local_1b0._12_4_,0xffffffff);
      *(long *)(pdVar3 + 0x30) = *(long *)(pdVar3 + 0x30) + 0x30;
    }
LAB_0012505a:
    while( true ) {
      psVar5 = this->stack_;
      pWVar14 = (psVar5->c).
                super__Deque_base<re2::WalkState<re2::Frag>,_std::allocator<re2::WalkState<re2::Frag>_>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_cur;
      if (pWVar14 ==
          (psVar5->c).
          super__Deque_base<re2::WalkState<re2::Frag>,_std::allocator<re2::WalkState<re2::Frag>_>_>.
          _M_impl.super__Deque_impl_data._M_finish._M_first) {
        pWVar14 = (psVar5->c).
                  super__Deque_base<re2::WalkState<re2::Frag>,_std::allocator<re2::WalkState<re2::Frag>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 10;
      }
      pRVar13 = pWVar14[-1].re;
      uVar15 = pWVar14[-1].n;
      if (uVar15 == 0xffffffff) break;
LAB_00125086:
      uVar1 = pRVar13->nsub_;
      if (uVar1 == 0) {
LAB_00125160:
        top_arg.begin =
             (*this->_vptr_Walker[3])
                       (this,pRVar13,pWVar14[-1].parent_arg,pWVar14[-1].pre_arg,
                        pWVar14[-1].child_args,(ulong)uVar15);
        top_arg.end.p = extraout_var_01.p;
        if ((1 < pRVar13->nsub_) && (pWVar14[-1].child_args != (Frag *)0x0)) {
          operator_delete__(pWVar14[-1].child_args);
        }
        goto LAB_001251ae;
      }
      if (uVar1 == 1) {
        paVar9 = &pRVar13->field_5;
      }
      else {
        paVar9 = (anon_union_8_2_3df47e5c_for_Regexp_7 *)(pRVar13->field_5).submany_;
      }
      if ((int)(uint)uVar1 <= (int)uVar15) goto LAB_00125160;
      if ((int)uVar15 < 1 || !use_copy) {
        pRVar13 = (Regexp *)paVar9[(int)uVar15].submany_;
LAB_00125257:
        pdVar3 = (deque<re2::WalkState<re2::Frag>,std::allocator<re2::WalkState<re2::Frag>>> *)
                 this->stack_;
        local_1b0._8_4_ = -1;
        local_1b0._12_4_ = pWVar14[-1].pre_arg.begin;
        local_1b0._16_4_ = pWVar14[-1].pre_arg.end;
        local_188 = (Frag *)0x0;
        uStack_19c = 0;
        PStack_198.p = 0;
        uStack_194 = 0;
        PStack_190.p = 0;
        plVar8 = *(long **)(pdVar3 + 0x30);
        local_1b0._0_8_ = pRVar13;
        if (plVar8 == (long *)(*(long *)(pdVar3 + 0x40) + -0x30)) {
          std::deque<re2::WalkState<re2::Frag>,std::allocator<re2::WalkState<re2::Frag>>>::
          _M_push_back_aux<re2::WalkState<re2::Frag>>(pdVar3,(WalkState<re2::Frag> *)local_1b0);
        }
        else {
          plVar8[4] = (ulong)uStack_18c << 0x20;
          plVar8[5] = 0;
          plVar8[2] = (ulong)(uint)local_1b0._16_4_;
          plVar8[3] = 0;
          *plVar8 = (long)pRVar13;
          plVar8[1] = CONCAT44(local_1b0._12_4_,0xffffffff);
          *(long *)(pdVar3 + 0x30) = *(long *)(pdVar3 + 0x30) + 0x30;
        }
      }
      else {
        pRVar13 = (Regexp *)paVar9[uVar15].submany_;
        if ((Regexp *)paVar9[uVar15 - 1].submany_ != pRVar13) goto LAB_00125257;
        FVar10.begin = (*this->_vptr_Walker[4])(this,pWVar14[-1].child_args[uVar15 - 1]);
        FVar10.end.p = extraout_var_00.p;
        pWVar14[-1].child_args[pWVar14[-1].n] = FVar10;
        pWVar14[-1].n = pWVar14[-1].n + 1;
      }
    }
    iVar2 = this->max_visits_;
    this->max_visits_ = iVar2 + -1;
    if (iVar2 < 1) {
      this->stopped_early_ = true;
      top_arg.begin = (*this->_vptr_Walker[5])(this,pRVar13,pWVar14[-1].parent_arg);
      top_arg.end.p = extraout_var_02.p;
    }
    else {
      local_1b0._0_8_ = local_1b0._0_8_ & 0xffffffffffffff00;
      top_arg.begin = (*this->_vptr_Walker[2])(this,pRVar13,pWVar14[-1].parent_arg,local_1b0);
      top_arg.end.p = extraout_var.p;
      pWVar14[-1].pre_arg = top_arg;
      if (local_1b0[0] == '\0') {
        pWVar14[-1].n = 0;
        pWVar14[-1].child_args = (Frag *)0x0;
        uVar1 = pRVar13->nsub_;
        uVar15 = (uint)uVar1;
        if (uVar1 != 0) {
          if (uVar15 == 1) {
            pWVar14[-1].child_args = &pWVar14[-1].child_arg;
            uVar15 = 0;
          }
          else {
            pFVar12 = (Frag *)operator_new__((ulong)uVar1 << 3);
            memset(pFVar12,0,(ulong)uVar1 << 3);
            pWVar14[-1].child_args = pFVar12;
            uVar15 = pWVar14[-1].n;
          }
        }
        goto LAB_00125086;
      }
    }
LAB_001251ae:
    std::deque<re2::WalkState<re2::Frag>,_std::allocator<re2::WalkState<re2::Frag>_>_>::pop_back
              (&this->stack_->c);
    psVar5 = this->stack_;
    ppWVar6 = (psVar5->c).
              super__Deque_base<re2::WalkState<re2::Frag>,_std::allocator<re2::WalkState<re2::Frag>_>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_node;
    pWVar11 = (psVar5->c).
              super__Deque_base<re2::WalkState<re2::Frag>,_std::allocator<re2::WalkState<re2::Frag>_>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    pWVar7 = (psVar5->c).
             super__Deque_base<re2::WalkState<re2::Frag>,_std::allocator<re2::WalkState<re2::Frag>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_first;
    if (((long)pWVar11 - (long)pWVar7 >> 4) * -0x5555555555555555 +
        (((long)ppWVar6 -
          (long)(psVar5->c).
                super__Deque_base<re2::WalkState<re2::Frag>,_std::allocator<re2::WalkState<re2::Frag>_>_>
                ._M_impl.super__Deque_impl_data._M_start._M_node >> 3) + -1 +
        (ulong)(ppWVar6 == (_Map_pointer)0x0)) * 10 !=
        ((long)(psVar5->c).
               super__Deque_base<re2::WalkState<re2::Frag>,_std::allocator<re2::WalkState<re2::Frag>_>_>
               ._M_impl.super__Deque_impl_data._M_start._M_last -
         (long)(psVar5->c).
               super__Deque_base<re2::WalkState<re2::Frag>,_std::allocator<re2::WalkState<re2::Frag>_>_>
               ._M_impl.super__Deque_impl_data._M_start._M_cur >> 4) * 0x5555555555555555) {
      if (pWVar11 == pWVar7) {
        pWVar11 = ppWVar6[-1] + 10;
      }
      if (pWVar11[-1].child_args == (Frag *)0x0) {
        pFVar12 = &pWVar11[-1].child_arg;
      }
      else {
        pFVar12 = pWVar11[-1].child_args + pWVar11[-1].n;
      }
      *pFVar12 = top_arg;
      pWVar11[-1].n = pWVar11[-1].n + 1;
      goto LAB_0012505a;
    }
  }
  return top_arg;
}

Assistant:

T Regexp::Walker<T>::WalkInternal(Regexp* re, T top_arg,
                                                       bool use_copy) {
  Reset();

  if (re == NULL) {
    LOG(DFATAL) << "Walk NULL";
    return top_arg;
  }

  stack_->push(WalkState<T>(re, top_arg));

  WalkState<T>* s;
  for (;;) {
    T t;
    s = &stack_->top();
    Regexp* re = s->re;
    switch (s->n) {
      case -1: {
        if (--max_visits_ < 0) {
          stopped_early_ = true;
          t = ShortVisit(re, s->parent_arg);
          break;
        }
        bool stop = false;
        s->pre_arg = PreVisit(re, s->parent_arg, &stop);
        if (stop) {
          t = s->pre_arg;
          break;
        }
        s->n = 0;
        s->child_args = NULL;
        if (re->nsub_ == 1)
          s->child_args = &s->child_arg;
        else if (re->nsub_ > 1)
          s->child_args = new T[re->nsub_];
        // Fall through.
      }
      default: {
        if (re->nsub_ > 0) {
          Regexp** sub = re->sub();
          if (s->n < re->nsub_) {
            if (use_copy && s->n > 0 && sub[s->n - 1] == sub[s->n]) {
              s->child_args[s->n] = Copy(s->child_args[s->n - 1]);
              s->n++;
            } else {
              stack_->push(WalkState<T>(sub[s->n], s->pre_arg));
            }
            continue;
          }
        }

        t = PostVisit(re, s->parent_arg, s->pre_arg, s->child_args, s->n);
        if (re->nsub_ > 1)
          delete[] s->child_args;
        break;
      }
    }

    // We've finished stack_->top().
    // Update next guy down.
    stack_->pop();
    if (stack_->size() == 0)
      return t;
    s = &stack_->top();
    if (s->child_args != NULL)
      s->child_args[s->n] = t;
    else
      s->child_arg = t;
    s->n++;
  }
}